

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.hpp
# Opt level: O1

string * __thiscall
Kandinsky::Constant::toString_abi_cxx11_(string *__return_storage_ptr__,Constant *this,bool param_1)

{
  undefined8 uVar1;
  double local_10;
  
  local_10 = this->m_value;
  if ((this->m_formatter).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_formatter)._M_invoker)
              (__return_storage_ptr__,(_Any_data *)&this->m_formatter,&local_10);
    return __return_storage_ptr__;
  }
  uVar1 = std::__throw_bad_function_call();
  return (string *)CONCAT71((int7)((ulong)uVar1 >> 8),1);
}

Assistant:

virtual std::string toString(bool /*evaluate*/ = false) const
        {
            return m_formatter(m_value);
        }